

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeSetStringSpan::addToSpanNotSet(UnicodeSetStringSpan *this,UChar32 c)

{
  UBool UVar1;
  UnicodeSet *pUVar2;
  UnicodeSet *newSet;
  UChar32 c_local;
  UnicodeSetStringSpan *this_local;
  
  if ((this->pSpanNotSet == (UnicodeSet *)0x0) || (this->pSpanNotSet == &this->spanSet)) {
    UVar1 = UnicodeSet::contains(&this->spanSet,c);
    if (UVar1 != '\0') {
      return;
    }
    pUVar2 = (UnicodeSet *)UnicodeSet::cloneAsThawed(&this->spanSet);
    if (pUVar2 == (UnicodeSet *)0x0) {
      return;
    }
    this->pSpanNotSet = pUVar2;
  }
  UnicodeSet::add(this->pSpanNotSet,c);
  return;
}

Assistant:

void UnicodeSetStringSpan::addToSpanNotSet(UChar32 c) {
    if(pSpanNotSet==NULL || pSpanNotSet==&spanSet) {
        if(spanSet.contains(c)) {
            return;  // Nothing to do.
        }
        UnicodeSet *newSet=(UnicodeSet *)spanSet.cloneAsThawed();
        if(newSet==NULL) {
            return;  // Out of memory.
        } else {
            pSpanNotSet=newSet;
        }
    }
    pSpanNotSet->add(c);
}